

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O3

value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
* __thiscall
nonstd::vptr::
value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
::operator=(value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
            *this,value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
                  *rhs)

{
  pointer piVar1;
  int *piVar2;
  
  if (this != rhs) {
    piVar1 = (rhs->ptr).ptr;
    if (piVar1 == (pointer)0x0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)operator_new(4);
      *piVar2 = *piVar1;
    }
    operator_delete((this->ptr).ptr);
    (this->ptr).ptr = piVar2;
  }
  return this;
}

Assistant:

value_ptr & operator=( value_ptr const & rhs )
    {
        if ( this == &rhs )
            return *this;

        if ( rhs ) ptr.reset( *rhs );
#if nsvp_HAVE_NULLPTR
        else       ptr.reset( nullptr );
#else
        else       ptr.reset( pointer(0) );
#endif
        return *this;
    }